

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O2

void Pf_StoDelete(Pf_Man_t *p)

{
  void **__ptr;
  int *piVar1;
  float *__ptr_00;
  Vec_Wec_t *__ptr_01;
  word *__ptr_02;
  void *pvVar2;
  int i;
  int i_00;
  Vec_Int_t *__ptr_03;
  long lVar3;
  Vec_Mem_t *pVVar4;
  int i_1;
  long lVar5;
  
  for (i_00 = 0; i_00 < (p->vPages).nSize; i_00 = i_00 + 1) {
    pvVar2 = Vec_PtrEntry(&p->vPages,i_00);
    if ((void *)0x2 < pvVar2) {
      free(pvVar2);
    }
  }
  __ptr = (p->vPages).pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vPages).pArray = (void **)0x0;
  }
  piVar1 = (p->vCutSets).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCutSets).pArray = (int *)0x0;
  }
  __ptr_00 = (p->vCutFlows).pArray;
  if (__ptr_00 != (float *)0x0) {
    free(__ptr_00);
    (p->vCutFlows).pArray = (float *)0x0;
  }
  piVar1 = (p->vCutDelays).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCutDelays).pArray = (int *)0x0;
  }
  if (p->pPfObjs != (Pf_Obj_t *)0x0) {
    free(p->pPfObjs);
    p->pPfObjs = (Pf_Obj_t *)0x0;
  }
  __ptr_01 = p->vTt2Match;
  __ptr_03 = __ptr_01->pArray;
  lVar5 = 8;
  for (lVar3 = 0; lVar3 < __ptr_01->nCap; lVar3 = lVar3 + 1) {
    pvVar2 = *(void **)((long)&__ptr_03->nCap + lVar5);
    if (pvVar2 != (void *)0x0) {
      free(pvVar2);
      __ptr_03 = __ptr_01->pArray;
      *(undefined8 *)((long)&__ptr_03->nCap + lVar5) = 0;
    }
    lVar5 = lVar5 + 0x10;
  }
  free(__ptr_03);
  free(__ptr_01);
  pVVar4 = p->vTtMem;
  if (pVVar4 == (Vec_Mem_t *)0x0) {
    pVVar4 = (Vec_Mem_t *)0x0;
  }
  else {
    Vec_IntFreeP(&pVVar4->vTable);
    Vec_IntFreeP(&pVVar4->vNexts);
    pVVar4 = p->vTtMem;
  }
  for (lVar5 = 0; lVar5 <= pVVar4->iPage; lVar5 = lVar5 + 1) {
    __ptr_02 = pVVar4->ppPages[lVar5];
    if (__ptr_02 != (word *)0x0) {
      free(__ptr_02);
      pVVar4->ppPages[lVar5] = (word *)0x0;
    }
  }
  free(pVVar4->ppPages);
  free(pVVar4);
  free(p->pCells);
  free(p);
  return;
}

Assistant:

void Pf_StoDelete( Pf_Man_t * p )
{
    Vec_PtrFreeData( &p->vPages );
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vCutSets.pArray );
    ABC_FREE( p->vCutFlows.pArray );
    ABC_FREE( p->vCutDelays.pArray );
    ABC_FREE( p->pPfObjs );
    // matching
    Vec_WecFree( p->vTt2Match );
    Vec_MemHashFree( p->vTtMem );
    Vec_MemFree( p->vTtMem );
    ABC_FREE( p->pCells );
    ABC_FREE( p );
}